

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

Status __thiscall google::protobuf::json_internal::JsonLexer::SkipValue(JsonLexer *this)

{
  int *piVar1;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  Status *_status;
  JsonLexer *in_RSI;
  string_view literal;
  string_view literal_00;
  string_view literal_01;
  string_view literal_02;
  string_view literal_03;
  string_view literal_04;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  local_88;
  
  PeekKind((JsonLexer *)&kind);
  absl::lts_20240722::Status::Status((Status *)this,(Status *)&kind);
  if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289ea0;
  absl::lts_20240722::Status::~Status((Status *)this);
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::EnsureOk
            (&kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>);
  switch(kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>.field_1.data_) {
  case kObj:
    Expect(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289ea0;
    absl::lts_20240722::Status::~Status((Status *)this);
    Push(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289ea0;
    absl::lts_20240722::Status::~Status((Status *)this);
    literal._M_str = "}";
    literal._M_len = 1;
    bVar4 = Peek(in_RSI,literal);
    if (bVar4) goto LAB_00289e73;
    bVar4 = true;
    do {
      if (bVar4 == false) {
        pcVar6 = "expected \',\'";
        goto LAB_00289f47;
      }
      SkipToToken(this);
      if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289ea0;
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::
      StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  *)&key.
                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                );
      cVar3 = ZeroCopyBufferedStream::PeekChar(&in_RSI->stream_);
      if ((cVar3 == '\"') ||
         (cVar3 = ZeroCopyBufferedStream::PeekChar(&in_RSI->stream_), cVar3 == '\'')) {
        ParseUtf8((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_88,in_RSI);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=(&key.
                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    ,&local_88);
LAB_00289ca0:
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData(&local_88);
        absl::lts_20240722::Status::Status
                  ((Status *)this,
                   (Status *)
                   &key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289d5a;
        absl::lts_20240722::Status::~Status((Status *)this);
        Expect(this);
        if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289d5a;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        SkipValue(this);
        if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289d5a;
        absl::lts_20240722::Status::~Status((Status *)this);
        literal_00._M_str = ",";
        literal_00._M_len = 1;
        bVar4 = Peek(in_RSI,literal_00);
        bVar5 = true;
      }
      else {
        if ((in_RSI->options_).allow_legacy_syntax == true) {
          ParseBareWord((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_88,in_RSI);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::operator=(&key.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      ,&local_88);
          goto LAB_00289ca0;
        }
        JsonLocation::Invalid((JsonLocation *)this,&in_RSI->json_loc_,0xc,"expected \'\"\'");
LAB_00289d5a:
        bVar5 = false;
      }
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData(&key.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     );
      if (!bVar5) goto LAB_00289ea0;
      literal_01._M_str = "}";
      literal_01._M_len = 1;
      bVar5 = Peek(in_RSI,literal_01);
    } while (!bVar5);
    piVar1 = &(in_RSI->options_).recursion_depth;
    *piVar1 = *piVar1 + 1;
    if (((in_RSI->options_).allow_legacy_syntax == false) && (bVar4 != false)) {
      pcVar6 = "expected \'}\'";
      goto LAB_00289f47;
    }
    goto LAB_00289e77;
  case kArr:
    Expect(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289ea0;
    absl::lts_20240722::Status::~Status((Status *)this);
    Push(this);
    if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289ea0;
    absl::lts_20240722::Status::~Status((Status *)this);
    literal_02._M_str = "]";
    literal_02._M_len = 1;
    bVar4 = Peek(in_RSI,literal_02);
    if (!bVar4) {
      do {
        SkipValue(this);
        if ((this->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_00289ea0;
        absl::lts_20240722::Status::~Status((Status *)this);
        literal_03._M_str = ",";
        literal_03._M_len = 1;
        bVar4 = Peek(in_RSI,literal_03);
        literal_04._M_str = "]";
        literal_04._M_len = 1;
        bVar5 = Peek(in_RSI,literal_04);
        if (bVar5) {
          if ((!bVar4) || ((in_RSI->options_).allow_legacy_syntax != false)) goto LAB_00289e73;
          pcVar6 = "expected \']\'";
          goto LAB_00289f47;
        }
      } while (bVar4);
      pcVar6 = "expected \',\'";
LAB_00289f47:
      JsonLocation::Invalid((JsonLocation *)this,&in_RSI->json_loc_,0xc,pcVar6);
      goto LAB_00289ea0;
    }
LAB_00289e73:
    piVar1 = &(in_RSI->options_).recursion_depth;
    *piVar1 = *piVar1 + 1;
LAB_00289e77:
    (this->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    goto LAB_00289ea0;
  case kStr:
    ParseUtf8(&key,in_RSI);
    aVar2 = key.
            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            .field_0;
    if (key.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      key.
      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      .field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  )0x37;
    }
    (this->stream_).stream_ = (ZeroCopyInputStream *)aVar2;
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData(&key.
                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   );
    goto LAB_00289ea0;
  case kNum:
    ParseNumber((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&key,in_RSI);
    aVar2 = key.
            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            .field_0;
    if (key.
        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        .field_0 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
      key.
      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      .field_0 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                  )0x37;
    }
    (this->stream_).stream_ = (ZeroCopyInputStream *)aVar2;
    absl::lts_20240722::Status::~Status((Status *)&key);
    goto LAB_00289ea0;
  case kTrue:
    break;
  case kFalse:
    break;
  case kNull:
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&key,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/json/internal/lexer.cc"
               ,0xa5,5,"false");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&key,(char (*) [12])"unreachable");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&key);
  }
  Expect(this);
LAB_00289ea0:
  absl::lts_20240722::Status::~Status((Status *)&kind);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status JsonLexer::SkipValue() {
  absl::StatusOr<Kind> kind = PeekKind();
  RETURN_IF_ERROR(kind.status());

  switch (*kind) {
    case JsonLexer::kObj:
      return VisitObject(
          [this](LocationWith<MaybeOwnedString>&) { return SkipValue(); });
    case JsonLexer::kArr:
      return VisitArray([this] { return SkipValue(); });
    case JsonLexer::kStr:
      return ParseUtf8().status();
    case JsonLexer::kNum:
      return ParseNumber().status();
    case JsonLexer::kTrue:
      return Expect("true");
    case JsonLexer::kFalse:
      return Expect("false");
    case JsonLexer::kNull:
      return Expect("null");
    default:
      break;
  }
  // Some compilers seem to fail to realize this is a basic block
  // terminator and incorrectly believe this function is missing
  // a return.
  ABSL_CHECK(false) << "unreachable";
  return absl::OkStatus();
}